

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O3

SnapArrayInfo<void_*> *
TTD::NSSnapObjects::ExtractArrayValues<void*>(JavascriptArray *arrayObject,SlabAllocator *alloc)

{
  uint lastIndex;
  uint32 uVar1;
  BOOL BVar2;
  uint32 firstIndex;
  SnapArrayInfoBlock<void_*> *pSVar3;
  SnapArrayInfoBlock<void_*> *pSVar4;
  SnapArrayInfoBlock<void_*> *pSVar5;
  SnapArrayInfo<void_*> *pSVar6;
  uint32 i;
  ulong uVar7;
  
  lastIndex = (arrayObject->super_ArrayObject).length;
  if ((ulong)lastIndex != 0) {
    if (lastIndex < 0x101) {
      uVar7 = 0;
      pSVar3 = AllocateArrayInfoBlock<void*,false>(alloc,0,lastIndex);
      do {
        BVar2 = Js::JavascriptArray::DirectGetItemAt<void*>
                          (arrayObject,(uint32)uVar7,pSVar3->ArrayRangeContents + uVar7);
        pSVar3->ArrayValidTags[uVar7] = (byte)BVar2;
        uVar7 = uVar7 + 1;
      } while (uVar7 != lastIndex);
      goto LAB_00b40846;
    }
    firstIndex = Js::JavascriptArray::GetNextIndex(arrayObject,0xffffffff);
    if (firstIndex != 0xffffffff) {
      pSVar3 = (SnapArrayInfoBlock<void_*> *)0x0;
      pSVar5 = (SnapArrayInfoBlock<void_*> *)0x0;
      do {
        pSVar4 = pSVar5;
        if (pSVar3 == (SnapArrayInfoBlock<void_*> *)0x0) {
          uVar1 = firstIndex + 0x200;
          if (0xfffffdff < firstIndex) {
            uVar1 = 0xffffffff;
          }
          pSVar4 = AllocateArrayInfoBlock<void*,true>(alloc,firstIndex,uVar1);
          pSVar3 = pSVar4;
        }
        if (pSVar4 == (SnapArrayInfoBlock<void_*> *)0x0) {
          TTDAbort_unrecoverable_error("Should get set with variable sai above when needed!");
        }
        pSVar5 = pSVar4;
        if (pSVar4->LastIndex <= firstIndex) {
          uVar1 = firstIndex + 0x200;
          if (0xfffffdff < firstIndex) {
            uVar1 = 0xffffffff;
          }
          pSVar5 = AllocateArrayInfoBlock<void*,true>(alloc,firstIndex,uVar1);
          pSVar4->Next = pSVar5;
        }
        pSVar5->ArrayValidTags[firstIndex - pSVar5->FirstIndex] = '\x01';
        Js::JavascriptArray::DirectGetItemAt<void*>
                  (arrayObject,firstIndex,
                   pSVar5->ArrayRangeContents + (firstIndex - pSVar5->FirstIndex));
        firstIndex = Js::JavascriptArray::GetNextIndex(arrayObject,firstIndex);
      } while (firstIndex != 0xffffffff);
      goto LAB_00b40846;
    }
  }
  pSVar3 = (SnapArrayInfoBlock<void_*> *)0x0;
LAB_00b40846:
  pSVar6 = (SnapArrayInfo<void_*> *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  pSVar6->Length = (arrayObject->super_ArrayObject).length;
  pSVar6->Data = pSVar3;
  return pSVar6;
}

Assistant:

SnapArrayInfo<T>* ExtractArrayValues(Js::JavascriptArray* arrayObject, SlabAllocator& alloc)
        {
            SnapArrayInfoBlock<T>* sai = nullptr;

            uint32 length = arrayObject->GetLength();
            if(length == 0)
            {
                ; //just leave it as a null ptr
            }
            else if(length <= TTD_ARRAY_SMALL_ARRAY)
            {
                sai = AllocateArrayInfoBlock<T, false>(alloc, 0, length);
                for(uint32 i = 0; i < length; ++i)
                {
                    sai->ArrayValidTags[i] = (byte)arrayObject->DirectGetItemAt<T>(i, sai->ArrayRangeContents + i);
                }
            }
            else
            {
                SnapArrayInfoBlock<T>* curr = nullptr;
                for(uint32 idx = arrayObject->GetNextIndex(Js::JavascriptArray::InvalidIndex); idx != Js::JavascriptArray::InvalidIndex; idx = arrayObject->GetNextIndex(idx))
                {
                    if(sai == nullptr)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        sai = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = sai;
                    }

                    TTDAssert(curr != nullptr, "Should get set with variable sai above when needed!");
                    if(idx >= curr->LastIndex)
                    {
                        uint32 endIdx = (idx <= (Js::JavascriptArray::MaxArrayLength - TTD_ARRAY_BLOCK_SIZE)) ? (idx + TTD_ARRAY_BLOCK_SIZE) : Js::JavascriptArray::MaxArrayLength;
                        curr->Next = AllocateArrayInfoBlock<T, true>(alloc, idx, endIdx);
                        curr = curr->Next;
                    }

                    curr->ArrayValidTags[idx - curr->FirstIndex] = TRUE;
                    arrayObject->DirectGetItemAt<T>(idx, curr->ArrayRangeContents + (idx - curr->FirstIndex));
                }
            }

            SnapArrayInfo<T>* res = alloc.SlabAllocateStruct< SnapArrayInfo<T> >();
            res->Length = arrayObject->GetLength();
            res->Data = sai;

            return res;
        }